

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

value_type * __thiscall
google::protobuf::
Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
CreateValueTypeInternal
          (Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,long *key)

{
  value_type *pvVar1;
  
  if (this->arena_ == (Arena *)0x0) {
    pvVar1 = (value_type *)operator_new(0x28);
    pvVar1->first = *key;
    (pvVar1->second)._M_dataplus._M_p = (pointer)&(pvVar1->second).field_2;
    (pvVar1->second)._M_string_length = 0;
    (pvVar1->second).field_2._M_local_buf[0] = '\0';
  }
  else {
    pvVar1 = (value_type *)
             Arena::AllocateAligned(this->arena_,(type_info *)&unsigned_char::typeinfo,0x28);
    pvVar1->first = 0;
    Arena::CreateInArenaStorage<std::__cxx11::string>(&pvVar1->second,this->arena_);
    pvVar1->first = *key;
  }
  return pvVar1;
}

Assistant:

value_type* CreateValueTypeInternal(const Key& key) {
    if (arena_ == NULL) {
      return new value_type(key);
    } else {
      value_type* value = reinterpret_cast<value_type*>(
          Arena::CreateArray<uint8>(arena_, sizeof(value_type)));
      Arena::CreateInArenaStorage(const_cast<Key*>(&value->first), arena_);
      Arena::CreateInArenaStorage(&value->second, arena_);
      const_cast<Key&>(value->first) = key;
      return value;
    }
  }